

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::V1LayerParameter::InternalSerializeWithCachedSizesToArray
          (V1LayerParameter *this,bool deterministic,uint8 *target)

{
  int iVar1;
  int iVar2;
  V1LayerParameter_LayerType value;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  string *psVar6;
  BlobProto *value_00;
  uint8 *target_00;
  NetStateRule *pNVar7;
  UnknownFieldSet *unknown_fields;
  int local_90;
  int n_5;
  int i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  V1LayerParameter *this_local;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar3 & 2) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::V0LayerParameter>
                   (1,this->layer_,deterministic,target);
  }
  i_1 = 0;
  iVar1 = bottom_size(this);
  for (; i_1 < iVar1; i_1 = i_1 + 1) {
    bottom_abi_cxx11_(this,i_1);
    pcVar5 = (char *)std::__cxx11::string::data();
    bottom_abi_cxx11_(this,i_1);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.V1LayerParameter.bottom");
    psVar6 = bottom_abi_cxx11_(this,i_1);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(2,psVar6,_i);
  }
  i_2 = 0;
  iVar1 = top_size(this);
  for (; (int)i_2 < iVar1; i_2 = i_2 + 1) {
    top_abi_cxx11_(this,i_2);
    pcVar5 = (char *)std::__cxx11::string::data();
    top_abi_cxx11_(this,i_2);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.V1LayerParameter.top");
    psVar6 = top_abi_cxx11_(this,i_2);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,psVar6,_i);
  }
  if ((uVar3 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar1,SERIALIZE,"caffe.V1LayerParameter.name");
    psVar6 = name_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(4,psVar6,_i);
  }
  if (((this->_has_bits_).has_bits_[1] & 1) != 0) {
    value = type(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(5,value,_i);
  }
  i_3 = 0;
  uVar3 = blobs_size(this);
  for (; i_3 < uVar3; i_3 = i_3 + 1) {
    value_00 = blobs(this,i_3);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::BlobProto>(6,value_00,deterministic,_i);
  }
  target_00 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(7,&this->blobs_lr_,_i);
  _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                 (8,&this->weight_decay_,target_00);
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 4) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ConcatParameter>
                   (9,this->concat_param_,deterministic,_i);
  }
  if ((uVar3 & 8) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ConvolutionParameter>
                   (10,this->convolution_param_,deterministic,_i);
  }
  if ((uVar3 & 0x10) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::DataParameter>
                   (0xb,this->data_param_,deterministic,_i);
  }
  if ((uVar3 & 0x20) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::DropoutParameter>
                   (0xc,this->dropout_param_,deterministic,_i);
  }
  if ((uVar3 & 0x40) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::HDF5DataParameter>
                   (0xd,this->hdf5_data_param_,deterministic,_i);
  }
  if ((uVar3 & 0x80) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::HDF5OutputParameter>
                   (0xe,this->hdf5_output_param_,deterministic,_i);
  }
  if ((uVar3 & 0x100) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ImageDataParameter>
                   (0xf,this->image_data_param_,deterministic,_i);
  }
  if ((uVar3 & 0x200) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::InfogainLossParameter>
                   (0x10,this->infogain_loss_param_,deterministic,_i);
  }
  if ((uVar3 & 0x400) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::InnerProductParameter>
                   (0x11,this->inner_product_param_,deterministic,_i);
  }
  if ((uVar3 & 0x800) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::LRNParameter>
                   (0x12,this->lrn_param_,deterministic,_i);
  }
  if ((uVar3 & 0x1000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::PoolingParameter>
                   (0x13,this->pooling_param_,deterministic,_i);
  }
  if ((uVar3 & 0x2000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::WindowDataParameter>
                   (0x14,this->window_data_param_,deterministic,_i);
  }
  if ((uVar3 & 0x4000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::PowerParameter>
                   (0x15,this->power_param_,deterministic,_i);
  }
  if ((uVar3 & 0x8000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::MemoryDataParameter>
                   (0x16,this->memory_data_param_,deterministic,_i);
  }
  if ((uVar3 & 0x10000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ArgMaxParameter>
                   (0x17,this->argmax_param_,deterministic,_i);
  }
  if ((uVar3 & 0x20000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::EltwiseParameter>
                   (0x18,this->eltwise_param_,deterministic,_i);
  }
  if ((uVar3 & 0x40000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ThresholdParameter>
                   (0x19,this->threshold_param_,deterministic,_i);
  }
  if ((uVar3 & 0x80000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::DummyDataParameter>
                   (0x1a,this->dummy_data_param_,deterministic,_i);
  }
  if ((uVar3 & 0x100000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::AccuracyParameter>
                   (0x1b,this->accuracy_param_,deterministic,_i);
  }
  if ((uVar3 & 0x200000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::HingeLossParameter>
                   (0x1d,this->hinge_loss_param_,deterministic,_i);
  }
  if ((uVar3 & 0x400000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ReLUParameter>
                   (0x1e,this->relu_param_,deterministic,_i);
  }
  if ((uVar3 & 0x800000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::SliceParameter>
                   (0x1f,this->slice_param_,deterministic,_i);
  }
  i_4 = 0;
  uVar4 = include_size(this);
  for (; i_4 < uVar4; i_4 = i_4 + 1) {
    pNVar7 = include(this,i_4);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetStateRule>(0x20,pNVar7,deterministic,_i);
  }
  i_5 = 0;
  uVar4 = exclude_size(this);
  for (; (uint)i_5 < uVar4; i_5 = i_5 + 1) {
    pNVar7 = exclude(this,i_5);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetStateRule>(0x21,pNVar7,deterministic,_i);
  }
  if ((uVar3 & 0x1000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::MVNParameter>
                   (0x22,this->mvn_param_,deterministic,_i);
  }
  _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x23,&this->loss_weight_,_i);
  if ((uVar3 & 0x2000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::TransformationParameter>
                   (0x24,this->transform_param_,deterministic,_i);
  }
  if ((uVar3 & 0x4000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::TanHParameter>
                   (0x25,this->tanh_param_,deterministic,_i);
  }
  if ((uVar3 & 0x8000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::SigmoidParameter>
                   (0x26,this->sigmoid_param_,deterministic,_i);
  }
  if ((uVar3 & 0x10000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::SoftmaxParameter>
                   (0x27,this->softmax_param_,deterministic,_i);
  }
  if ((uVar3 & 0x20000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ContrastiveLossParameter>
                   (0x28,this->contrastive_loss_param_,deterministic,_i);
  }
  if ((uVar3 & 0x40000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::ExpParameter>
                   (0x29,this->exp_param_,deterministic,_i);
  }
  if ((uVar3 & 0x80000000) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::LossParameter>
                   (0x2a,this->loss_param_,deterministic,_i);
  }
  local_90 = 0;
  iVar1 = param_size(this);
  for (; local_90 < iVar1; local_90 = local_90 + 1) {
    param_abi_cxx11_(this,local_90);
    pcVar5 = (char *)std::__cxx11::string::data();
    param_abi_cxx11_(this,local_90);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.V1LayerParameter.param");
    psVar6 = param_abi_cxx11_(this,local_90);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x3e9,psVar6,_i);
  }
  _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                 (0x3ea,&this->blob_share_mode_,_i);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = V1LayerParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* V1LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V1LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.V0LayerParameter layer = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->layer_, deterministic, target);
  }

  // repeated string bottom = 2;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.bottom");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->bottom(i), target);
  }

  // repeated string top = 3;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.top");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->top(i), target);
  }

  // optional string name = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->name(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.V1LayerParameter.LayerType type = 5;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // repeated .caffe.BlobProto blobs = 6;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 7;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(7, this->blobs_lr_, target);

  // repeated float weight_decay = 8;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(8, this->weight_decay_, target);

  cached_has_bits = _has_bits_[0];
  // optional .caffe.ConcatParameter concat_param = 9;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->concat_param_, deterministic, target);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 10;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        10, *this->convolution_param_, deterministic, target);
  }

  // optional .caffe.DataParameter data_param = 11;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        11, *this->data_param_, deterministic, target);
  }

  // optional .caffe.DropoutParameter dropout_param = 12;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        12, *this->dropout_param_, deterministic, target);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 13;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        13, *this->hdf5_data_param_, deterministic, target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 14;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        14, *this->hdf5_output_param_, deterministic, target);
  }

  // optional .caffe.ImageDataParameter image_data_param = 15;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, *this->image_data_param_, deterministic, target);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 16;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        16, *this->infogain_loss_param_, deterministic, target);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 17;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        17, *this->inner_product_param_, deterministic, target);
  }

  // optional .caffe.LRNParameter lrn_param = 18;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        18, *this->lrn_param_, deterministic, target);
  }

  // optional .caffe.PoolingParameter pooling_param = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        19, *this->pooling_param_, deterministic, target);
  }

  // optional .caffe.WindowDataParameter window_data_param = 20;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        20, *this->window_data_param_, deterministic, target);
  }

  // optional .caffe.PowerParameter power_param = 21;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->power_param_, deterministic, target);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 22;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, *this->memory_data_param_, deterministic, target);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 23;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        23, *this->argmax_param_, deterministic, target);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 24;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        24, *this->eltwise_param_, deterministic, target);
  }

  // optional .caffe.ThresholdParameter threshold_param = 25;
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->threshold_param_, deterministic, target);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 26;
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->dummy_data_param_, deterministic, target);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 27;
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, *this->accuracy_param_, deterministic, target);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 29;
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        29, *this->hinge_loss_param_, deterministic, target);
  }

  // optional .caffe.ReLUParameter relu_param = 30;
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        30, *this->relu_param_, deterministic, target);
  }

  // optional .caffe.SliceParameter slice_param = 31;
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        31, *this->slice_param_, deterministic, target);
  }

  // repeated .caffe.NetStateRule include = 32;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        32, this->include(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule exclude = 33;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        33, this->exclude(i), deterministic, target);
  }

  // optional .caffe.MVNParameter mvn_param = 34;
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        34, *this->mvn_param_, deterministic, target);
  }

  // repeated float loss_weight = 35;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(35, this->loss_weight_, target);

  // optional .caffe.TransformationParameter transform_param = 36;
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        36, *this->transform_param_, deterministic, target);
  }

  // optional .caffe.TanHParameter tanh_param = 37;
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        37, *this->tanh_param_, deterministic, target);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 38;
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        38, *this->sigmoid_param_, deterministic, target);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 39;
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        39, *this->softmax_param_, deterministic, target);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 40;
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        40, *this->contrastive_loss_param_, deterministic, target);
  }

  // optional .caffe.ExpParameter exp_param = 41;
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        41, *this->exp_param_, deterministic, target);
  }

  // optional .caffe.LossParameter loss_param = 42;
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        42, *this->loss_param_, deterministic, target);
  }

  // repeated string param = 1001;
  for (int i = 0, n = this->param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->param(i).data(), this->param(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.param");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1001, this->param(i), target);
  }

  // repeated .caffe.V1LayerParameter.DimCheckMode blob_share_mode = 1002;
  target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
    1002, this->blob_share_mode_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V1LayerParameter)
  return target;
}